

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

int __thiscall Potassco::Application::main(Application *this,int argc,char **argv)

{
  uint __sig;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  __sighandler_t p_Var4;
  undefined8 extraout_RAX;
  int __how;
  int __how_00;
  Application *pAVar5;
  uint *puVar3;
  
  instance_s = this;
  this->exitCode_ = 1;
  this->pending_ = 0;
  this->blocked_ = this->pending_;
  pAVar5 = this;
  bVar1 = getOptions(this,argc,argv);
  if (bVar1) {
    pAVar5 = this;
    iVar2 = (*this->_vptr_Application[2])();
    for (puVar3 = (uint *)CONCAT44(extraout_var,iVar2); puVar3 != (uint *)0x0; puVar3 = puVar3 + 1)
    {
      __sig = *puVar3;
      pAVar5 = (Application *)(ulong)__sig;
      if (__sig == 0) break;
      p_Var4 = signal(__sig,sigHandler);
      if (p_Var4 == (__sighandler_t)0x1) {
        pAVar5 = (Application *)(ulong)*puVar3;
        signal(*puVar3,(__sighandler_t)0x1);
      }
    }
    if (this->timeout_ != 0) {
      setAlarm(pAVar5,this->timeout_);
    }
    this->exitCode_ = 0;
    (*this->_vptr_Application[0xe])(this);
    (*this->_vptr_Application[0xf])(this);
    pAVar5 = this;
    shutdown(this,0,__how);
  }
  while (this->fastExit_ == true) {
    exit(pAVar5,this->exitCode_);
    __cxa_begin_catch(extraout_RAX);
    pAVar5 = this;
    shutdown(this,1,__how_00);
    __cxa_end_catch();
  }
  fflush(_stdout);
  fflush(_stderr);
  return this->exitCode_;
}

Assistant:

int Application::main(int argc, char** argv) {
	initInstance(*this); // singleton instance used for signal handling
	exitCode_ = EXIT_FAILURE;
	blocked_  = pending_ = 0;
	if (getOptions(argc, argv)) {
		// install signal handlers
		for (const int* sig = getSignals(); sig && *sig; ++sig) {
			if (signal(*sig, &Application::sigHandler) == SIG_IGN) {
				signal(*sig, SIG_IGN);
			}
		}
		if (timeout_) {
			if (setAlarm(timeout_) == 0) { warn("Could not set time limit!"); }
		}
		exitCode_ = EXIT_SUCCESS;
		try         { setup(); run(); shutdown(false); }
		catch (...) { shutdown(true); }
	}
	if (fastExit_) { exit(exitCode_); }
	fflush(stdout);
	fflush(stderr);
	return exitCode_;
}